

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O0

_Bool ecs_enable_locking(ecs_world_t *world,_Bool enable)

{
  _Bool _Var1;
  ecs_os_mutex_t eVar2;
  ecs_os_cond_t eVar3;
  _Bool old;
  _Bool enable_local;
  ecs_world_t *world_local;
  
  if (enable) {
    if ((world->locking_enabled & 1U) == 0) {
      eVar2 = (*ecs_os_api.mutex_new_)();
      world->mutex = eVar2;
      eVar2 = (*ecs_os_api.mutex_new_)();
      world->thr_sync = eVar2;
      eVar3 = (*ecs_os_api.cond_new_)();
      world->thr_cond = eVar3;
    }
  }
  else if ((world->locking_enabled & 1U) != 0) {
    (*ecs_os_api.mutex_free_)(world->mutex);
    (*ecs_os_api.mutex_free_)(world->thr_sync);
    (*ecs_os_api.cond_free_)(world->thr_cond);
  }
  _Var1 = world->locking_enabled;
  world->locking_enabled = enable;
  return (_Bool)(_Var1 & 1);
}

Assistant:

bool ecs_enable_locking(
    ecs_world_t *world,
    bool enable)
{
    if (enable) {
        if (!world->locking_enabled) {
            world->mutex = ecs_os_mutex_new();
            world->thr_sync = ecs_os_mutex_new();
            world->thr_cond = ecs_os_cond_new();
        }
    } else {
        if (world->locking_enabled) {
            ecs_os_mutex_free(world->mutex);
            ecs_os_mutex_free(world->thr_sync);
            ecs_os_cond_free(world->thr_cond);
        }
    }

    bool old = world->locking_enabled;
    world->locking_enabled = enable;
    return old;
}